

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  char cVar19;
  int iVar20;
  undefined4 uVar21;
  ulong uVar22;
  long lVar23;
  ulong unaff_RBX;
  ulong uVar24;
  ulong uVar25;
  NodeRef *pNVar26;
  NodeRef *pNVar27;
  ulong uVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  uint uVar33;
  float fVar34;
  uint uVar35;
  float fVar36;
  uint uVar37;
  vint4 ai;
  float fVar38;
  uint uVar39;
  float fVar40;
  uint uVar41;
  float fVar43;
  float fVar45;
  vint4 ai_1;
  uint uVar44;
  uint uVar46;
  float fVar47;
  uint uVar48;
  undefined1 auVar42 [16];
  uint uVar49;
  uint uVar50;
  uint uVar51;
  vint4 ai_2;
  uint uVar52;
  float fVar53;
  uint uVar54;
  float fVar55;
  float fVar56;
  uint uVar57;
  float fVar58;
  float fVar59;
  uint uVar60;
  float fVar61;
  vint4 ai_3;
  float fVar62;
  uint uVar63;
  float fVar64;
  undefined1 auVar65 [16];
  float fVar66;
  float fVar70;
  float fVar71;
  vint4 bi_7;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  undefined1 auVar69 [16];
  float fVar73;
  float fVar77;
  float fVar78;
  vint4 bi_4;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vint4 bi_2;
  vint4 bi;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  pNVar27 = stack + 1;
  do {
    pNVar26 = pNVar27;
    if (pNVar26 == stack) break;
    pNVar27 = pNVar26 + -1;
    sVar29 = pNVar26[-1].ptr;
    do {
      iVar20 = (int)(sVar29 & 0xf);
      if ((sVar29 & 0xf) == 0) {
        pfVar1 = (float *)(sVar29 + 0x20 + uVar30);
        fVar32 = (*pfVar1 - fVar2) * fVar8;
        fVar34 = (pfVar1[1] - fVar2) * fVar8;
        fVar36 = (pfVar1[2] - fVar2) * fVar8;
        fVar38 = (pfVar1[3] - fVar2) * fVar8;
        pfVar1 = (float *)(sVar29 + 0x20 + uVar31);
        fVar40 = (*pfVar1 - fVar3) * fVar9;
        fVar43 = (pfVar1[1] - fVar3) * fVar9;
        fVar45 = (pfVar1[2] - fVar3) * fVar9;
        fVar47 = (pfVar1[3] - fVar3) * fVar9;
        uVar41 = (uint)((int)fVar40 < (int)fVar32) * (int)fVar32 |
                 (uint)((int)fVar40 >= (int)fVar32) * (int)fVar40;
        uVar44 = (uint)((int)fVar43 < (int)fVar34) * (int)fVar34 |
                 (uint)((int)fVar43 >= (int)fVar34) * (int)fVar43;
        uVar46 = (uint)((int)fVar45 < (int)fVar36) * (int)fVar36 |
                 (uint)((int)fVar45 >= (int)fVar36) * (int)fVar45;
        uVar48 = (uint)((int)fVar47 < (int)fVar38) * (int)fVar38 |
                 (uint)((int)fVar47 >= (int)fVar38) * (int)fVar47;
        pfVar1 = (float *)(sVar29 + 0x20 + uVar24);
        fVar32 = (*pfVar1 - fVar4) * fVar10;
        fVar34 = (pfVar1[1] - fVar4) * fVar10;
        fVar36 = (pfVar1[2] - fVar4) * fVar10;
        fVar38 = (pfVar1[3] - fVar4) * fVar10;
        pfVar1 = (float *)(sVar29 + 0x20 + (uVar30 ^ 0x10));
        fVar40 = (*pfVar1 - fVar2) * fVar8;
        fVar43 = (pfVar1[1] - fVar2) * fVar8;
        fVar45 = (pfVar1[2] - fVar2) * fVar8;
        fVar47 = (pfVar1[3] - fVar2) * fVar8;
        pfVar1 = (float *)(sVar29 + 0x20 + (uVar31 ^ 0x10));
        fVar53 = (*pfVar1 - fVar3) * fVar9;
        fVar56 = (pfVar1[1] - fVar3) * fVar9;
        fVar59 = (pfVar1[2] - fVar3) * fVar9;
        fVar62 = (pfVar1[3] - fVar3) * fVar9;
        uVar54 = (uint)((int)fVar40 < (int)fVar53) * (int)fVar40 |
                 (uint)((int)fVar40 >= (int)fVar53) * (int)fVar53;
        uVar57 = (uint)((int)fVar43 < (int)fVar56) * (int)fVar43 |
                 (uint)((int)fVar43 >= (int)fVar56) * (int)fVar56;
        uVar60 = (uint)((int)fVar45 < (int)fVar59) * (int)fVar45 |
                 (uint)((int)fVar45 >= (int)fVar59) * (int)fVar59;
        uVar63 = (uint)((int)fVar47 < (int)fVar62) * (int)fVar47 |
                 (uint)((int)fVar47 >= (int)fVar62) * (int)fVar62;
        pfVar1 = (float *)(sVar29 + 0x20 + (uVar24 ^ 0x10));
        fVar40 = (*pfVar1 - fVar4) * fVar10;
        fVar43 = (pfVar1[1] - fVar4) * fVar10;
        fVar45 = (pfVar1[2] - fVar4) * fVar10;
        fVar47 = (pfVar1[3] - fVar4) * fVar10;
        uVar33 = (uint)((int)fVar32 < iVar11) * iVar11 | (uint)((int)fVar32 >= iVar11) * (int)fVar32
        ;
        uVar35 = (uint)((int)fVar34 < iVar11) * iVar11 | (uint)((int)fVar34 >= iVar11) * (int)fVar34
        ;
        uVar37 = (uint)((int)fVar36 < iVar11) * iVar11 | (uint)((int)fVar36 >= iVar11) * (int)fVar36
        ;
        uVar39 = (uint)((int)fVar38 < iVar11) * iVar11 | (uint)((int)fVar38 >= iVar11) * (int)fVar38
        ;
        uVar49 = (uint)(iVar12 < (int)fVar40) * iVar12 | (uint)(iVar12 >= (int)fVar40) * (int)fVar40
        ;
        uVar50 = (uint)(iVar12 < (int)fVar43) * iVar12 | (uint)(iVar12 >= (int)fVar43) * (int)fVar43
        ;
        uVar51 = (uint)(iVar12 < (int)fVar45) * iVar12 | (uint)(iVar12 >= (int)fVar45) * (int)fVar45
        ;
        uVar52 = (uint)(iVar12 < (int)fVar47) * iVar12 | (uint)(iVar12 >= (int)fVar47) * (int)fVar47
        ;
        auVar13._4_4_ =
             -(uint)((int)(((int)uVar57 < (int)uVar50) * uVar57 |
                          ((int)uVar57 >= (int)uVar50) * uVar50) <
                    (int)(((int)uVar35 < (int)uVar44) * uVar44 |
                         ((int)uVar35 >= (int)uVar44) * uVar35));
        auVar13._0_4_ =
             -(uint)((int)(((int)uVar54 < (int)uVar49) * uVar54 |
                          ((int)uVar54 >= (int)uVar49) * uVar49) <
                    (int)(((int)uVar33 < (int)uVar41) * uVar41 |
                         ((int)uVar33 >= (int)uVar41) * uVar33));
        auVar13._8_4_ =
             -(uint)((int)(((int)uVar60 < (int)uVar51) * uVar60 |
                          ((int)uVar60 >= (int)uVar51) * uVar51) <
                    (int)(((int)uVar37 < (int)uVar46) * uVar46 |
                         ((int)uVar37 >= (int)uVar46) * uVar37));
        auVar13._12_4_ =
             -(uint)((int)(((int)uVar63 < (int)uVar52) * uVar63 |
                          ((int)uVar63 >= (int)uVar52) * uVar52) <
                    (int)(((int)uVar39 < (int)uVar48) * uVar48 |
                         ((int)uVar39 >= (int)uVar48) * uVar39));
        uVar21 = movmskps(iVar20,auVar13);
        unaff_RBX = (ulong)(byte)((byte)uVar21 ^ 0xf);
LAB_0029d73e:
        bVar18 = true;
      }
      else {
        if (iVar20 == 2) {
          uVar28 = sVar29 & 0xfffffffffffffff0;
          auVar67._0_4_ =
               fVar5 * *(float *)(uVar28 + 0x20) +
               fVar6 * *(float *)(uVar28 + 0x50) + fVar7 * *(float *)(uVar28 + 0x80);
          auVar67._4_4_ =
               fVar5 * *(float *)(uVar28 + 0x24) +
               fVar6 * *(float *)(uVar28 + 0x54) + fVar7 * *(float *)(uVar28 + 0x84);
          auVar67._8_4_ =
               fVar5 * *(float *)(uVar28 + 0x28) +
               fVar6 * *(float *)(uVar28 + 0x58) + fVar7 * *(float *)(uVar28 + 0x88);
          auVar67._12_4_ =
               fVar5 * *(float *)(uVar28 + 0x2c) +
               fVar6 * *(float *)(uVar28 + 0x5c) + fVar7 * *(float *)(uVar28 + 0x8c);
          auVar74._0_4_ =
               fVar5 * *(float *)(uVar28 + 0x30) +
               fVar6 * *(float *)(uVar28 + 0x60) + fVar7 * *(float *)(uVar28 + 0x90);
          auVar74._4_4_ =
               fVar5 * *(float *)(uVar28 + 0x34) +
               fVar6 * *(float *)(uVar28 + 100) + fVar7 * *(float *)(uVar28 + 0x94);
          auVar74._8_4_ =
               fVar5 * *(float *)(uVar28 + 0x38) +
               fVar6 * *(float *)(uVar28 + 0x68) + fVar7 * *(float *)(uVar28 + 0x98);
          auVar74._12_4_ =
               fVar5 * *(float *)(uVar28 + 0x3c) +
               fVar6 * *(float *)(uVar28 + 0x6c) + fVar7 * *(float *)(uVar28 + 0x9c);
          auVar80._0_4_ =
               fVar5 * *(float *)(uVar28 + 0x40) +
               fVar6 * *(float *)(uVar28 + 0x70) + fVar7 * *(float *)(uVar28 + 0xa0);
          auVar80._4_4_ =
               fVar5 * *(float *)(uVar28 + 0x44) +
               fVar6 * *(float *)(uVar28 + 0x74) + fVar7 * *(float *)(uVar28 + 0xa4);
          auVar80._8_4_ =
               fVar5 * *(float *)(uVar28 + 0x48) +
               fVar6 * *(float *)(uVar28 + 0x78) + fVar7 * *(float *)(uVar28 + 0xa8);
          auVar80._12_4_ =
               fVar5 * *(float *)(uVar28 + 0x4c) +
               fVar6 * *(float *)(uVar28 + 0x7c) + fVar7 * *(float *)(uVar28 + 0xac);
          uVar33 = (uint)DAT_01fec6c0;
          uVar35 = DAT_01fec6c0._4_4_;
          uVar37 = DAT_01fec6c0._8_4_;
          uVar39 = DAT_01fec6c0._12_4_;
          fVar32 = (float)DAT_01ff1d40;
          fVar34 = DAT_01ff1d40._4_4_;
          fVar36 = DAT_01ff1d40._8_4_;
          fVar38 = DAT_01ff1d40._12_4_;
          auVar68._4_4_ = -(uint)((float)((uint)auVar67._4_4_ & uVar35) < fVar34);
          auVar68._0_4_ = -(uint)((float)((uint)auVar67._0_4_ & uVar33) < fVar32);
          auVar68._8_4_ = -(uint)((float)((uint)auVar67._8_4_ & uVar37) < fVar36);
          auVar68._12_4_ = -(uint)((float)((uint)auVar67._12_4_ & uVar39) < fVar38);
          auVar68 = blendvps(auVar67,_DAT_01ff1d40,auVar68);
          auVar75._4_4_ = -(uint)((float)((uint)auVar74._4_4_ & uVar35) < fVar34);
          auVar75._0_4_ = -(uint)((float)((uint)auVar74._0_4_ & uVar33) < fVar32);
          auVar75._8_4_ = -(uint)((float)((uint)auVar74._8_4_ & uVar37) < fVar36);
          auVar75._12_4_ = -(uint)((float)((uint)auVar74._12_4_ & uVar39) < fVar38);
          auVar75 = blendvps(auVar74,_DAT_01ff1d40,auVar75);
          auVar81._4_4_ = -(uint)((float)((uint)auVar80._4_4_ & uVar35) < fVar34);
          auVar81._0_4_ = -(uint)((float)((uint)auVar80._0_4_ & uVar33) < fVar32);
          auVar81._8_4_ = -(uint)((float)((uint)auVar80._8_4_ & uVar37) < fVar36);
          auVar81._12_4_ = -(uint)((float)((uint)auVar80._12_4_ & uVar39) < fVar38);
          auVar81 = blendvps(auVar80,_DAT_01ff1d40,auVar81);
          auVar82 = rcpps(_DAT_01fec6c0,auVar68);
          fVar32 = auVar82._0_4_;
          fVar34 = auVar82._4_4_;
          fVar36 = auVar82._8_4_;
          fVar38 = auVar82._12_4_;
          fVar32 = (1.0 - auVar68._0_4_ * fVar32) * fVar32 + fVar32;
          fVar34 = (1.0 - auVar68._4_4_ * fVar34) * fVar34 + fVar34;
          fVar36 = (1.0 - auVar68._8_4_ * fVar36) * fVar36 + fVar36;
          fVar38 = (1.0 - auVar68._12_4_ * fVar38) * fVar38 + fVar38;
          auVar68 = rcpps(auVar82,auVar75);
          fVar66 = auVar68._0_4_;
          fVar70 = auVar68._4_4_;
          fVar71 = auVar68._8_4_;
          fVar72 = auVar68._12_4_;
          fVar66 = (1.0 - auVar75._0_4_ * fVar66) * fVar66 + fVar66;
          fVar70 = (1.0 - auVar75._4_4_ * fVar70) * fVar70 + fVar70;
          fVar71 = (1.0 - auVar75._8_4_ * fVar71) * fVar71 + fVar71;
          fVar72 = (1.0 - auVar75._12_4_ * fVar72) * fVar72 + fVar72;
          auVar68 = rcpps(auVar68,auVar81);
          fVar73 = auVar68._0_4_;
          fVar77 = auVar68._4_4_;
          fVar78 = auVar68._8_4_;
          fVar79 = auVar68._12_4_;
          fVar73 = (1.0 - auVar81._0_4_ * fVar73) * fVar73 + fVar73;
          fVar77 = (1.0 - auVar81._4_4_ * fVar77) * fVar77 + fVar77;
          fVar78 = (1.0 - auVar81._8_4_ * fVar78) * fVar78 + fVar78;
          fVar79 = (1.0 - auVar81._12_4_ * fVar79) * fVar79 + fVar79;
          auVar16._4_4_ = iVar12;
          auVar16._0_4_ = iVar12;
          auVar16._8_4_ = iVar12;
          auVar16._12_4_ = iVar12;
          auVar17._4_4_ = iVar11;
          auVar17._0_4_ = iVar11;
          auVar17._8_4_ = iVar11;
          auVar17._12_4_ = iVar11;
          fVar55 = (*(float *)(uVar28 + 0x20) * fVar2 +
                   *(float *)(uVar28 + 0x50) * fVar3 +
                   *(float *)(uVar28 + 0x80) * fVar4 + *(float *)(uVar28 + 0xb0)) * -fVar32;
          fVar58 = (*(float *)(uVar28 + 0x24) * fVar2 +
                   *(float *)(uVar28 + 0x54) * fVar3 +
                   *(float *)(uVar28 + 0x84) * fVar4 + *(float *)(uVar28 + 0xb4)) * -fVar34;
          fVar61 = (*(float *)(uVar28 + 0x28) * fVar2 +
                   *(float *)(uVar28 + 0x58) * fVar3 +
                   *(float *)(uVar28 + 0x88) * fVar4 + *(float *)(uVar28 + 0xb8)) * -fVar36;
          fVar64 = (*(float *)(uVar28 + 0x2c) * fVar2 +
                   *(float *)(uVar28 + 0x5c) * fVar3 +
                   *(float *)(uVar28 + 0x8c) * fVar4 + *(float *)(uVar28 + 0xbc)) * -fVar38;
          fVar53 = (*(float *)(uVar28 + 0x30) * fVar2 +
                   *(float *)(uVar28 + 0x60) * fVar3 +
                   *(float *)(uVar28 + 0x90) * fVar4 + *(float *)(uVar28 + 0xc0)) * -fVar66;
          fVar56 = (*(float *)(uVar28 + 0x34) * fVar2 +
                   *(float *)(uVar28 + 100) * fVar3 +
                   *(float *)(uVar28 + 0x94) * fVar4 + *(float *)(uVar28 + 0xc4)) * -fVar70;
          fVar59 = (*(float *)(uVar28 + 0x38) * fVar2 +
                   *(float *)(uVar28 + 0x68) * fVar3 +
                   *(float *)(uVar28 + 0x98) * fVar4 + *(float *)(uVar28 + 200)) * -fVar71;
          fVar62 = (*(float *)(uVar28 + 0x3c) * fVar2 +
                   *(float *)(uVar28 + 0x6c) * fVar3 +
                   *(float *)(uVar28 + 0x9c) * fVar4 + *(float *)(uVar28 + 0xcc)) * -fVar72;
          fVar40 = (*(float *)(uVar28 + 0x40) * fVar2 +
                   *(float *)(uVar28 + 0x70) * fVar3 +
                   *(float *)(uVar28 + 0xa0) * fVar4 + *(float *)(uVar28 + 0xd0)) * -fVar73;
          fVar43 = (*(float *)(uVar28 + 0x44) * fVar2 +
                   *(float *)(uVar28 + 0x74) * fVar3 +
                   *(float *)(uVar28 + 0xa4) * fVar4 + *(float *)(uVar28 + 0xd4)) * -fVar77;
          fVar45 = (*(float *)(uVar28 + 0x48) * fVar2 +
                   *(float *)(uVar28 + 0x78) * fVar3 +
                   *(float *)(uVar28 + 0xa8) * fVar4 + *(float *)(uVar28 + 0xd8)) * -fVar78;
          fVar47 = (*(float *)(uVar28 + 0x4c) * fVar2 +
                   *(float *)(uVar28 + 0x7c) * fVar3 +
                   *(float *)(uVar28 + 0xac) * fVar4 + *(float *)(uVar28 + 0xdc)) * -fVar79;
          fVar32 = fVar32 + fVar55;
          fVar34 = fVar34 + fVar58;
          fVar36 = fVar36 + fVar61;
          fVar38 = fVar38 + fVar64;
          fVar66 = fVar66 + fVar53;
          fVar70 = fVar70 + fVar56;
          fVar71 = fVar71 + fVar59;
          fVar72 = fVar72 + fVar62;
          fVar73 = fVar73 + fVar40;
          fVar77 = fVar77 + fVar43;
          fVar78 = fVar78 + fVar45;
          fVar79 = fVar79 + fVar47;
          auVar65._0_4_ =
               (uint)((int)fVar66 < (int)fVar53) * (int)fVar66 |
               (uint)((int)fVar66 >= (int)fVar53) * (int)fVar53;
          auVar65._4_4_ =
               (uint)((int)fVar70 < (int)fVar56) * (int)fVar70 |
               (uint)((int)fVar70 >= (int)fVar56) * (int)fVar56;
          auVar65._8_4_ =
               (uint)((int)fVar71 < (int)fVar59) * (int)fVar71 |
               (uint)((int)fVar71 >= (int)fVar59) * (int)fVar59;
          auVar65._12_4_ =
               (uint)((int)fVar72 < (int)fVar62) * (int)fVar72 |
               (uint)((int)fVar72 >= (int)fVar62) * (int)fVar62;
          auVar14._4_4_ =
               (uint)((int)fVar77 < (int)fVar43) * (int)fVar77 |
               (uint)((int)fVar77 >= (int)fVar43) * (int)fVar43;
          auVar14._0_4_ =
               (uint)((int)fVar73 < (int)fVar40) * (int)fVar73 |
               (uint)((int)fVar73 >= (int)fVar40) * (int)fVar40;
          auVar14._8_4_ =
               (uint)((int)fVar78 < (int)fVar45) * (int)fVar78 |
               (uint)((int)fVar78 >= (int)fVar45) * (int)fVar45;
          auVar14._12_4_ =
               (uint)((int)fVar79 < (int)fVar47) * (int)fVar79 |
               (uint)((int)fVar79 >= (int)fVar47) * (int)fVar47;
          auVar75 = maxps(auVar65,auVar14);
          auVar69._0_4_ =
               (uint)((int)fVar66 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar66 >= (int)fVar53) * (int)fVar66;
          auVar69._4_4_ =
               (uint)((int)fVar70 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar70 >= (int)fVar56) * (int)fVar70;
          auVar69._8_4_ =
               (uint)((int)fVar71 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar71 >= (int)fVar59) * (int)fVar71;
          auVar69._12_4_ =
               (uint)((int)fVar72 < (int)fVar62) * (int)fVar62 |
               (uint)((int)fVar72 >= (int)fVar62) * (int)fVar72;
          auVar76._0_4_ =
               (uint)((int)fVar73 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar73 >= (int)fVar40) * (int)fVar73;
          auVar76._4_4_ =
               (uint)((int)fVar77 < (int)fVar43) * (int)fVar43 |
               (uint)((int)fVar77 >= (int)fVar43) * (int)fVar77;
          auVar76._8_4_ =
               (uint)((int)fVar78 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar78 >= (int)fVar45) * (int)fVar78;
          auVar76._12_4_ =
               (uint)((int)fVar79 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar79 >= (int)fVar47) * (int)fVar79;
          auVar81 = minps(auVar69,auVar76);
          auVar15._4_4_ =
               (uint)((int)fVar34 < (int)fVar58) * (int)fVar34 |
               (uint)((int)fVar34 >= (int)fVar58) * (int)fVar58;
          auVar15._0_4_ =
               (uint)((int)fVar32 < (int)fVar55) * (int)fVar32 |
               (uint)((int)fVar32 >= (int)fVar55) * (int)fVar55;
          auVar15._8_4_ =
               (uint)((int)fVar36 < (int)fVar61) * (int)fVar36 |
               (uint)((int)fVar36 >= (int)fVar61) * (int)fVar61;
          auVar15._12_4_ =
               (uint)((int)fVar38 < (int)fVar64) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar64) * (int)fVar64;
          auVar68 = maxps(auVar17,auVar15);
          auVar68 = maxps(auVar68,auVar75);
          auVar82._4_4_ =
               (uint)((int)fVar34 < (int)fVar58) * (int)fVar58 |
               (uint)((int)fVar34 >= (int)fVar58) * (int)fVar34;
          auVar82._0_4_ =
               (uint)((int)fVar32 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar32 >= (int)fVar55) * (int)fVar32;
          auVar82._8_4_ =
               (uint)((int)fVar36 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar36 >= (int)fVar61) * (int)fVar36;
          auVar82._12_4_ =
               (uint)((int)fVar38 < (int)fVar64) * (int)fVar64 |
               (uint)((int)fVar38 >= (int)fVar64) * (int)fVar38;
          auVar75 = minps(auVar16,auVar82);
          auVar75 = minps(auVar75,auVar81);
          auVar42._4_4_ = -(uint)(auVar68._4_4_ <= auVar75._4_4_);
          auVar42._0_4_ = -(uint)(auVar68._0_4_ <= auVar75._0_4_);
          auVar42._8_4_ = -(uint)(auVar68._8_4_ <= auVar75._8_4_);
          auVar42._12_4_ = -(uint)(auVar68._12_4_ <= auVar75._12_4_);
          uVar21 = movmskps((int)unaff_RBX,auVar42);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar21);
          goto LAB_0029d73e;
        }
        bVar18 = false;
      }
      if (bVar18) {
        if (unaff_RBX == 0) {
          uVar33 = 4;
        }
        else {
          uVar28 = sVar29 & 0xfffffffffffffff0;
          lVar23 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar33 = 0;
          sVar29 = *(size_t *)(uVar28 + lVar23 * 8);
          uVar25 = unaff_RBX - 1 & unaff_RBX;
          if (uVar25 != 0) {
            pNVar27->ptr = sVar29;
            lVar23 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            uVar22 = uVar25 - 1;
            while( true ) {
              pNVar27 = pNVar27 + 1;
              sVar29 = *(size_t *)(uVar28 + lVar23 * 8);
              uVar22 = uVar22 & uVar25;
              if (uVar22 == 0) break;
              pNVar27->ptr = sVar29;
              lVar23 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              uVar25 = uVar22 - 1;
            }
          }
        }
      }
      else {
        uVar33 = 6;
      }
    } while (uVar33 == 0);
    if (uVar33 == 6) {
      cVar19 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar29 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar33 = 0;
      if (cVar19 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar33 = 1;
      }
    }
  } while ((uVar33 & 3) == 0);
  return pNVar26 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }